

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_high_compression.c
# Opt level: O0

void test_read_format_zip_high_compression2(void)

{
  int iVar1;
  char *pcVar2;
  la_ssize_t v2;
  longlong local_68;
  int64_t o;
  size_t s;
  void *pv;
  size_t used;
  archive_entry *entry;
  archive *a;
  void *pvStack_30;
  int n;
  char *buff;
  char *body_read;
  char *body;
  size_t buff_size;
  size_t body_size;
  
  buff_size = 0x100000;
  body = "";
  pcVar2 = archive_zlib_version();
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                   ,L'Y');
    test_skipping("Zip compression test requires zlib");
  }
  else {
    body_read = (char *)malloc(0x100000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                     ,L']',(uint)(body_read != (char *)0x0),"(body = malloc(body_size)) != NULL",
                     (void *)0x0);
    buff = (char *)malloc(0x100000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                     ,L'^',(uint)(buff != (char *)0x0),"(body_read = malloc(body_size)) != NULL",
                     (void *)0x0);
    pvStack_30 = malloc(0x200000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                     ,L'_',(uint)(pvStack_30 != (void *)0x0),"(buff = malloc(buff_size)) != NULL",
                     (void *)0x0);
    for (a._4_4_ = 0x400; a._4_4_ < 0x100000; a._4_4_ = a._4_4_ + 0x400) {
      pv = (void *)0x0;
      memset(body_read,0xff,0x100000);
      body_read[a._4_4_] = '\x01';
      entry = (archive_entry *)archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                       ,L's',(uint)(entry != (archive_entry *)0x0),
                       "(a = archive_write_new()) != NULL",(void *)0x0);
      iVar1 = archive_write_set_format_zip((archive *)entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L't',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                          (void *)0x0);
      iVar1 = archive_write_open_memory((archive *)entry,pvStack_30,0x200000,(size_t *)&pv);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'u',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, buff_size, &used)",(void *)0x0);
      used = (size_t)archive_entry_new2((archive_conflict *)entry);
      archive_entry_set_pathname((archive_entry *)used,"test");
      archive_entry_set_filetype((archive_entry *)used,0x8000);
      archive_entry_set_size((archive_entry *)used,0x40006);
      iVar1 = archive_write_header((archive *)entry,(archive_entry *)used);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'{',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free((archive_entry *)used);
      v2 = archive_write_data((archive *)entry,body_read,0x40006);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'}',0x40006,"262150",v2,"archive_write_data(a, body, 262150)",
                          (void *)0x0);
      iVar1 = archive_write_free((archive *)entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'~',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      entry = (archive_entry *)archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                       ,L'\x81',(uint)(entry != (archive_entry *)0x0),
                       "(a = archive_read_new()) != NULL",(void *)0x0);
      iVar1 = archive_read_support_format_all((archive *)entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x82',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          entry);
      iVar1 = archive_read_support_filter_all((archive *)entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x83',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          entry);
      iVar1 = read_open_memory((archive *)entry,pvStack_30,(size_t)pv,0x11);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x84',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory(a, buff, used, 17)",
                          entry);
      iVar1 = archive_read_next_header((archive *)entry,(archive_entry **)&used);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x85',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &entry)",
                          (void *)0x0);
      iVar1 = archive_read_data_block((archive *)entry,(void **)&s,(size_t *)&o,&local_68);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x87',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_read_data_block(a, &pv, &s, &o)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x88',0x40000,"262144",o,"s",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x89',0,"0",local_68,"o",(void *)0x0);
      iVar1 = archive_read_data_block((archive *)entry,(void **)&s,(size_t *)&o,&local_68);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x8b',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_read_data_block(a, &pv, &s, &o)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x8c',6,"6",o,"s",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x8d',0x40000,"262144",local_68,"o",(void *)0x0);
      iVar1 = archive_read_data_block((archive *)entry,(void **)&s,(size_t *)&o,&local_68);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x8f',1,"ARCHIVE_EOF",(long)iVar1,
                          "archive_read_data_block(a, &pv, &s, &o)",(void *)0x0);
      iVar1 = archive_free((archive *)entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x91',0,"ARCHIVE_OK",(long)iVar1,"archive_free(a)",(void *)0x0);
    }
    free(body_read);
    free(buff);
    free(pvStack_30);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_high_compression2)
{
	const size_t body_size = 1024 * 1024;
	const size_t buff_size = 2 * 1024 * 1024;
	char *body, *body_read, *buff;
	int n;

	if (archive_zlib_version() == NULL) {
		skipping("Zip compression test requires zlib");
		return;
	}

	assert((body = malloc(body_size)) != NULL);
	assert((body_read = malloc(body_size)) != NULL);
	assert((buff = malloc(buff_size)) != NULL);

	/* Highly-compressible data: all bytes 255, except for a
	 * single 1 byte.
	 * The body is always 256k + 6 bytes long (the internal deflation
	 * buffer is exactly 256k).
	 */

	for(n = 1024; n < (int)body_size; n += 1024) {
		struct archive *a;
		struct archive_entry *entry;
		size_t used = 0;
		const void *pv;
		size_t s;
		int64_t o;

		memset(body, 255, body_size);
		body[n] = 1;

		/* Write an archive with a single entry of n bytes. */
		assert((a = archive_write_new()) != NULL);
		assertEqualInt(ARCHIVE_OK, archive_write_set_format_zip(a));
		assertEqualInt(ARCHIVE_OK, archive_write_open_memory(a, buff, buff_size, &used));

		entry = archive_entry_new2(a);
		archive_entry_set_pathname(entry, "test");
		archive_entry_set_filetype(entry, AE_IFREG);
		archive_entry_set_size(entry, 262150);
		assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
		archive_entry_free(entry);
		assertEqualInt(262150, archive_write_data(a, body, 262150));
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));

		/* Read back the entry and verify the contents. */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK, read_open_memory(a, buff, used, 17));
		assertEqualInt(ARCHIVE_OK, archive_read_next_header(a, &entry));

		assertEqualInt(ARCHIVE_OK, archive_read_data_block(a, &pv, &s, &o));
		assertEqualInt(262144, s);
		assertEqualInt(0, o);

		assertEqualInt(ARCHIVE_OK, archive_read_data_block(a, &pv, &s, &o));
		assertEqualInt(6, s);
		assertEqualInt(262144, o);

		assertEqualInt(ARCHIVE_EOF, archive_read_data_block(a, &pv, &s, &o));

		assertEqualInt(ARCHIVE_OK, archive_free(a));
	}

	free(body);
	free(body_read);
	free(buff);
}